

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

void __thiscall Assimp::FICDATAValueImpl::~FICDATAValueImpl(FICDATAValueImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_FICDATAValue).super_FIStringValue.super_FIValue._vptr_FIValue =
       (_func_int **)&PTR___cxa_pure_virtual_0098a7e0;
  pcVar2 = (this->super_FICDATAValue).super_FIStringValue.value._M_dataplus._M_p;
  paVar1 = &(this->super_FICDATAValue).super_FIStringValue.value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

inline FICDATAValueImpl(std::string &&value_) { value = std::move(value_); }